

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

string * duckdb::Date::RangeError(string *__return_storage_ptr__,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator local_51;
  string local_50;
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,"date field value out of range: \"%s\"",&local_51);
  ::std::__cxx11::string::string((string *)&local_50,(string *)str);
  StringUtil::Format<std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_30,&local_50,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

string Date::RangeError(const string &str) {
	return StringUtil::Format("date field value out of range: \"%s\"", str);
}